

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onRequest(Connection *this,Request *request)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  Promise<void> *this_01;
  PromiseAwaiter<void> *pPVar1;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar2;
  Promise<kj::HttpServer::Connection::LoopResult> *promise;
  Connection *pCVar3;
  HttpOutputStream *this_02;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *attachments_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params;
  PromiseAwaiter<bool> *__return_storage_ptr__;
  Promise<bool> *promise_00;
  char cVar4;
  undefined4 uVar5;
  long lVar6;
  PromiseArenaMember *pPVar7;
  long *plVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  SourceLocation location;
  OwnPromiseNode OVar13;
  PromiseBase PVar14;
  Own<kj::AsyncInputStream,_std::nullptr_t> *attachments_1;
  bool bVar15;
  LoopResult LVar16;
  coroutine_handle<void> coroutine;
  undefined8 *puVar17;
  undefined4 *in_RDX;
  int iVar18;
  FixVoid<kj::HttpServer::Connection::LoopResult> *pFVar19;
  void *continuationTracePtr_2;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_errorHandler local_a1;
  OwnPromiseNode local_a0;
  OwnPromiseNode local_98;
  int *local_90;
  undefined1 local_88 [16];
  Connection *local_78;
  PromiseBase local_70;
  OwnPromiseNode local_68;
  Own<kj::AsyncInputStream,_std::nullptr_t> *local_60;
  ExceptionOrValue *local_58;
  PromiseBase local_50;
  anon_class_8_1_8991fb9c_for_func local_48;
  undefined4 local_40 [2];
  undefined4 local_38;
  
  coroutine._M_fr_ptr = operator_new(0xbb0);
  *(code **)coroutine._M_fr_ptr = onRequest;
  *(code **)((long)coroutine._M_fr_ptr + 8) = onRequest;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x10);
  *(Request **)((long)coroutine._M_fr_ptr + 0xb80) = request;
  local_88._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_88._8_8_ = "onRequest";
  local_78 = (Connection *)0x1b00001e2a;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642758;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006427a0;
  local_58 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "onRequest";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1e2a;
  location.columnNumber = 0x1b;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_58,location);
  local_90 = (int *)((long)coroutine._M_fr_ptr + 0xad0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642758;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006427a0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  uVar5 = *in_RDX;
  if ((char)request[0xd].url.content.size_ != '\0') {
    *(undefined1 *)&request[0xd].url.content.size_ = 0;
    if (request[0xe].method == HEAD) {
      request[0xe].method = GET;
    }
    if (request[0xe].method == POST) {
      request[0xe].method = GET;
    }
  }
  request[0xe].method = HEAD;
  *(undefined4 *)&request[0xe].url.content.ptr = uVar5;
  *(undefined1 *)&request[0xd].url.content.size_ = 1;
  uVar5 = *in_RDX;
  uVar9 = in_RDX[2];
  uVar10 = in_RDX[3];
  uVar11 = in_RDX[4];
  uVar12 = in_RDX[5];
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xad0) = 1;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xad8) = uVar5;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xae0) = uVar9;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xae4) = uVar10;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xae8) = uVar11;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0xaec) = uVar12;
  *(StringPtr **)((long)coroutine._M_fr_ptr + 0xaf0) = &request[5].url;
  *(Request **)((long)coroutine._M_fr_ptr + 0xaf8) = request;
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  (**(code **)**(undefined8 **)(request + 2))
            ((long)coroutine._M_fr_ptr + 0xb10,*(undefined8 **)(request + 2),local_90);
  if (*(char *)((long)&request[0xe].url.content.size_ + 6) == '\x01') {
    *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xb8c) =
         BREAK_LOOP_CONN_ERR;
    bVar15 = true;
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
              (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                       ((long)coroutine._M_fr_ptr + 0xb8c));
    goto LAB_003f98e0;
  }
  lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0xb18);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb18) = 0;
  if (lVar6 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              ((Fault *)local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1e37,FAILED,"kj::mv(maybeService) != nullptr",
               "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
               (char (*) [70])
               "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
    kj::_::Debug::Fault::fatal((Fault *)local_88);
  }
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb20) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb10);
  *(long *)((long)coroutine._M_fr_ptr + 0xb28) = lVar6;
  local_40[0] = 1;
  local_38 = *in_RDX;
  anon_unknown_36::HttpInputStreamImpl::getEntityBody
            ((HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0xb30),(int)request + 0x38,
             (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)local_40,(HttpHeaders *)0x0);
  attachments = (Own<kj::HttpService,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0xb60);
  local_40[0] = 0;
  (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb28))
            (attachments,*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb28),*in_RDX,
             *(undefined8 *)(in_RDX + 2),*(undefined8 *)(in_RDX + 4),&request[5].url,
             *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb38),request);
  this_01 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0xb58);
  Promise<void>::attach<kj::Own<kj::HttpService,decltype(nullptr)>>(this_01,attachments);
  pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x760);
  co_await<void>(pPVar1,this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 0;
  bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                     ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
  if (bVar15) {
    return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
  }
  kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
  if (*(char *)((long)coroutine._M_fr_ptr + 0x778) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x780));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
  pPVar7 = &((this_01->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
  if (pPVar7 != (PromiseArenaMember *)0x0) {
    (this_01->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar7);
  }
  pPVar7 = (PromiseArenaMember *)attachments->disposer;
  if (pPVar7 != (PromiseArenaMember *)0x0) {
    attachments->disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar7);
  }
  lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0xb80);
  cVar4 = *(char *)(lVar6 + 0x168);
  iVar18 = 0;
  if (cVar4 == '\x01') {
    pPVar2 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
             ((long)coroutine._M_fr_ptr + 0x5a8);
    promise = (Promise<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xb68)
    ;
    (promise->super_PromiseBase).node.ptr = *(PromiseNode **)(lVar6 + 0x170);
    *(undefined8 *)(lVar6 + 0x170) = 0;
    *(undefined1 *)(lVar6 + 0x168) = 0;
    co_await<kj::HttpServer::Connection::LoopResult>(pPVar2,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 1;
    bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (bVar15) {
      return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
    }
    LVar16 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar2);
    *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xb90) = LVar16
    ;
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
              (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                       ((long)coroutine._M_fr_ptr + 0xb90));
    if (*(char *)((long)coroutine._M_fr_ptr + 0x5c0) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x5c8));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
    pPVar7 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    iVar18 = 3;
    if (pPVar7 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar7);
    }
  }
  if (cVar4 == '\0') {
    lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0xb80);
    if (*(char *)(lVar6 + 0x162) == '\x01') {
      if (*(char *)(lVar6 + 0x163) == '\0') {
        if (kj::_::Debug::minSeverity < 4) {
          kj::_::Debug::log<char_const(&)[90]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x1e51,FATAL,
                     "\"Accepted WebSocket object must be destroyed before HttpService \" \"request handler completes.\""
                     ,(char (*) [90])
                      "Accepted WebSocket object must be destroyed before HttpService request handler completes."
                    );
        }
        abort();
      }
      pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                ((long)coroutine._M_fr_ptr + 0xb94);
LAB_003f9872:
      *pFVar19 = BREAK_LOOP_CONN_ERR;
    }
    else {
      if (*(char *)(lVar6 + 0x148) == '\x01') {
        pCVar3 = (Connection *)((long)coroutine._M_fr_ptr + 0xb48);
        sendError(pCVar3);
        pPVar2 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                 ((long)coroutine._M_fr_ptr + 0x238);
        co_await<kj::HttpServer::Connection::LoopResult>
                  (pPVar2,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar3);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 2;
        bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
        if (bVar15) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
        }
        LVar16 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar2)
        ;
        *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xb98) =
             LVar16;
        kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                  (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                           ((long)coroutine._M_fr_ptr + 0xb98));
        kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar2);
        pPVar7 = (PromiseArenaMember *)(pCVar3->super_Response)._vptr_Response;
        iVar18 = 3;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          (pCVar3->super_Response)._vptr_Response = (_func_int **)0x0;
          kj::_::PromiseDisposer::dispose(pPVar7);
        }
        goto LAB_003f9885;
      }
      if (*(char *)(lVar6 + 0x141) == '\x01') {
        pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                  ((long)coroutine._M_fr_ptr + 0xb9c);
        goto LAB_003f9872;
      }
      this_02 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0xb40);
      anon_unknown_36::HttpOutputStream::flush(this_02);
      pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x918);
      co_await<void>(pPVar1,(Promise<void> *)this_02);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 3;
      bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)pPVar1,(CoroutineBase *)this_00);
      if (bVar15) {
        return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
      }
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar1);
      pPVar7 = (PromiseArenaMember *)
               (this_02->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
               currentWrapper.ptr;
      if (pPVar7 != (PromiseArenaMember *)0x0) {
        (this_02->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
        currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar7);
      }
      pCVar3 = *(Connection **)((long)coroutine._M_fr_ptr + 0xb80);
      if (((pCVar3->httpInput).broken != false) || ((pCVar3->httpInput).pendingMessageCount != 0)) {
        puVar17 = (undefined8 *)operator_new(8);
        *puVar17 = &PTR_write_0063e9a0;
        *(undefined8 **)((long)coroutine._M_fr_ptr + 0xb00) =
             &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>::instance;
        *(undefined8 **)((long)coroutine._M_fr_ptr + 0xb08) = puVar17;
        local_88._0_8_ = (Exception *)((long)coroutine._M_fr_ptr + 0xb30);
        local_88._8_8_ =
             (Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0xb00);
        local_78 = pCVar3;
        evalNow<kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_1_>
                  ((kj *)&local_a0,(anon_class_24_3_9e98ddcd *)local_88);
        pCVar3 = *(Connection **)((long)coroutine._M_fr_ptr + 0xb80);
        local_70.node.ptr =
             (OwnPromiseNode)
             kj::_::
             TransformPromiseNode<unsigned_long,_kj::_::IdentityFunc<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7820:17)>
             ::anon_class_1_0_00000001_for_errorHandler::operator();
        local_60 = (Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0xb00);
        kj::_::PromiseDisposer::
        appendPromise<kj::_::TransformPromiseNode<unsigned_long,kj::_::IdentityFunc<unsigned_long>,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(kj::Exception&&)_1_>,kj::_::PromiseDisposer,kj::_::IdentityFunc<unsigned_long>,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(kj::Exception&&)_1_,void*&>
                  ((PromiseDisposer *)&local_98,&local_a0,(IdentityFunc<unsigned_long> *)&local_48,
                   &local_a1,(void **)&local_70);
        local_68.ptr = local_98.ptr;
        local_70.node.ptr =
             (OwnPromiseNode)
             kj::_::
             SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7825:15)>
             ::anon_class_8_1_8991fb9c_for_func::operator();
        local_48.this = pCVar3;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(unsigned_long)_1_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda(unsigned_long)_1_,void*&>
                  ((PromiseDisposer *)&local_98,&local_68,&local_48,(void **)&local_70);
        OVar13.ptr = local_68.ptr;
        *(PromiseNode **)((long)coroutine._M_fr_ptr + 0xb50) = local_98.ptr;
        if (&(local_68.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
          local_68.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar13.ptr)->super_PromiseArenaMember);
        }
        attachments_1 = local_60;
        OVar13.ptr = local_a0.ptr;
        if (&(local_a0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
          local_a0.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar13.ptr)->super_PromiseArenaMember);
        }
        attachments_00 =
             (Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
             ((long)coroutine._M_fr_ptr + 0xb50);
        Promise<bool>::
        attach<kj::Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,decltype(nullptr)>,kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                  ((Promise<bool> *)local_88,attachments_00,attachments_1);
        pPVar7 = (PromiseArenaMember *)attachments_00->disposer;
        attachments_00->disposer = (Disposer *)local_88._0_8_;
        local_88._0_8_ = (Exception *)0x0;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose(pPVar7);
        }
        lVar6 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0xb80) + 0x18);
        plVar8 = *(long **)(lVar6 + 8);
        (**(code **)(*plVar8 + 0x10))(&local_98,plVar8,*(undefined8 *)(lVar6 + 0x40));
        params = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                 ((long)coroutine._M_fr_ptr + 0xb70);
        local_88._0_8_ =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7837:17)>
             ::anon_class_1_0_00000001_for_func::operator();
        kj::_::PromiseDisposer::
        appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_2_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::onRequest(kj::HttpHeaders::Request&)::_lambda()_2_,void*&>
                  ((PromiseDisposer *)&local_70,&local_98,
                   (anon_class_1_0_00000001_for_func *)&local_68,(void **)local_88);
        OVar13.ptr = local_98.ptr;
        params->ptr = (PromiseNode *)local_70.node.ptr;
        if (&(local_98.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
          local_98.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar13.ptr)->super_PromiseArenaMember);
        }
        __return_storage_ptr__ = (PromiseAwaiter<bool> *)((long)coroutine._M_fr_ptr + 0x3f0);
        promise_00 = (Promise<bool> *)((long)coroutine._M_fr_ptr + 0xb78);
        local_88._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
        ;
        local_88._8_8_ = "onRequest";
        local_78 = (Connection *)0x1d00001e9f;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_70,(OwnPromiseNode *)attachments_00,params,
                   (SourceLocation *)local_88);
        PVar14.node.ptr = local_70.node.ptr;
        local_70.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
        (promise_00->super_PromiseBase).node.ptr = (PromiseNode *)PVar14.node.ptr;
        co_await<bool>(__return_storage_ptr__,promise_00);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 4;
        bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
        if (bVar15) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
        }
        bVar15 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr__);
        kj::_::PromiseAwaiter<bool>::~PromiseAwaiter(__return_storage_ptr__);
        pPVar7 = &((promise_00->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          (promise_00->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar7);
        }
        if ((bVar15) && (*(char *)(*(long *)((long)coroutine._M_fr_ptr + 0xb80) + 0x164) == '\0')) {
          pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                    ((long)coroutine._M_fr_ptr + 0xb88);
          *pFVar19 = CONTINUE_LOOP;
        }
        else {
          pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                    ((long)coroutine._M_fr_ptr + 0xba8);
          *pFVar19 = BREAK_LOOP_CONN_ERR;
        }
        kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill(this_00,pFVar19);
        pPVar7 = &params->ptr->super_PromiseArenaMember;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          params->ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar7);
        }
        pPVar7 = (PromiseArenaMember *)attachments_00->disposer;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          attachments_00->disposer = (Disposer *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar7);
        }
        plVar8 = *(long **)((long)coroutine._M_fr_ptr + 0xb08);
        iVar18 = 3;
        if (plVar8 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb08) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb00))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb00),
                     (long)plVar8 + *(long *)(*plVar8 + -0x10));
        }
        goto LAB_003f9885;
      }
      if (pCVar3->closeAfterSend == true) {
        pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                  ((long)coroutine._M_fr_ptr + 0xba0);
        goto LAB_003f9872;
      }
      pFVar19 = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                ((long)coroutine._M_fr_ptr + 0xba4);
      *pFVar19 = CONTINUE_LOOP;
    }
    iVar18 = 3;
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill(this_00,pFVar19);
  }
LAB_003f9885:
  plVar8 = *(long **)((long)coroutine._M_fr_ptr + 0xb38);
  if (plVar8 != (long *)0x0) {
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb38) = 0;
    (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb30))
              (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb30),
               (long)plVar8 + *(long *)(*plVar8 + -0x10));
  }
  plVar8 = *(long **)((long)coroutine._M_fr_ptr + 0xb28);
  if (plVar8 != (long *)0x0) {
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb28) = 0;
    (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb20))
              (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb20),
               (long)plVar8 + *(long *)(*plVar8 + -0x10));
  }
  bVar15 = iVar18 == 3;
LAB_003f98e0:
  plVar8 = *(long **)((long)coroutine._M_fr_ptr + 0xb18);
  if (plVar8 != (long *)0x0) {
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb18) = 0;
    (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb10))
              (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb10),
               (long)plVar8 + *(long *)(*plVar8 + -0x10));
  }
  if (*local_90 == 1) {
    *local_90 = 0;
  }
  if (*local_90 == 2) {
    *local_90 = 0;
  }
  if (bVar15) {
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xbac) = 5;
  }
  else {
    if ((local_58->exception).ptr.isSet == true) {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
    }
    kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
    operator_delete(coroutine._M_fr_ptr,0xbb0);
  }
  return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_50.node.ptr;
}

Assistant:

kj::Promise<LoopResult> onRequest(HttpHeaders::Request& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = request.method;

    SuspendableRequest suspendable(*this, request.method, request.url, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");

    // TODO(perf): If the client disconnects, should we cancel the response? Probably, to
    //   prevent permanent deadlock. It's slightly weird in that arguably the client should
    //   be able to shutdown the upstream but still wait on the downstream, but I believe many
    //   other HTTP servers do similar things.

    auto body = httpInput.getEntityBody(
        HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_await service->request(
        request.method, request.url, headers, *body, *this).attach(kj::mv(service));
    // Response done. Await next request.

    KJ_IF_SOME(p, webSocketError) {
      // sendWebSocketError() was called. Finish sending and close the connection.
      auto promise = kj::mv(p);
      webSocketError = kj::none;
      co_return co_await promise;
    }

    if (upgraded) {
      // We've upgraded to WebSocket, and by now we should have closed the WebSocket.
      if (!webSocketOrConnectClosed) {
        // This is gonna segfault later so abort now instead.
        KJ_LOG(FATAL, "Accepted WebSocket object must be destroyed before HttpService "
                      "request handler completes.");
        abort();
      }

      // Once we start a WebSocket there's no going back to HTTP.
      co_return BREAK_LOOP_CONN_ERR;
    }

    if (currentMethod != kj::none) {
      co_return co_await sendError();
    }

    if (httpOutput.isBroken()) {
      // We started a response but didn't finish it. But HttpService returns success?
      // Perhaps it decided that it doesn't want to finish this response. We'll have to
      // disconnect here. If the response body is not complete (e.g. Content-Length not
      // reached), the client should notice. We don't want to log an error because this
      // condition might be intentional on the service's part.
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();

    if (httpInput.canReuse()) {
      // Things look clean. Go ahead and accept the next request.

      if (closeAfterSend) {
        // We sent Connection: close, so drop the connection now.
        co_return BREAK_LOOP_CONN_ERR;
      } else {
        // Note that we don't have to handle server.draining here because we'll take care
        // of it the next time around the loop.
        co_return CONTINUE_LOOP;
      }
    } else {
      // Apparently, the application did not read the request body. Maybe this is a bug,
      // or maybe not: maybe the client tried to upload too much data and the application
      // legitimately wants to cancel the upload without reading all it it.
      //
      // We have a problem, though: We did send a response, and we didn't send
      // `Connection: close`, so the client may expect that it can send another request.
      // Perhaps the client has even finished sending the previous request's body, in
      // which case the moment it finishes receiving the response, it could be completely
      // within its rights to start a new request. If we close the socket now, we might
      // interrupt that new request.
      //
      // Or maybe we did send `Connection: close`, as indicated by `closeAfterSend` being
      // true. Even in that case, we should still try to read and ignore the request,
      // otherwise when we close the connection the client may get a "connection reset"
      // error before they get a chance to actually read the response body that we sent
      // them.
      //
      // There's no way we can get out of this perfectly cleanly. HTTP just isn't good
      // enough at connection management. The best we can do is give the client some grace
      // period and then abort the connection.

      auto dummy = kj::heap<HttpDiscardingEntityWriter>();
      auto lengthGrace = kj::evalNow([&]() {
        return body->pumpTo(*dummy, server.settings.canceledUploadGraceBytes);
      }).catch_([](kj::Exception&& e) -> uint64_t {
        // Reading from the input failed in some way. This may actually be the whole
        // reason we got here in the first place so don't propagate this error, just
        // give up on discarding the input.
        return 0;  // This zero is ignored but `canReuse()` will return false below.
      }).then([this](uint64_t amount) {
        if (httpInput.canReuse()) {
          // Success, we can continue.
          return true;
        } else {
          // Still more data. Give up.
          return false;
        }
      });
      lengthGrace = lengthGrace.attach(kj::mv(dummy), kj::mv(body));

      auto timeGrace = server.timer.afterDelay(server.settings.canceledUploadGracePeriod)
          .then([]() { return false; });

      auto clean = co_await lengthGrace.exclusiveJoin(kj::mv(timeGrace));
      if (clean && !closeAfterSend) {
        // We recovered. Continue loop.
        co_return CONTINUE_LOOP;
      } else {
        // Client still not done, or we sent Connection: close and so want to drop the
        // connection anyway. Return broken.
        co_return BREAK_LOOP_CONN_ERR;
      }
    }
  }